

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCDouble.h
# Opt level: O2

HighsCDouble * __thiscall HighsCDouble::operator/=(HighsCDouble *this,HighsCDouble *v)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  HighsCDouble HVar4;
  HighsCDouble local_38;
  HighsCDouble local_28;
  
  dVar3 = v->hi + v->lo;
  auVar1._8_8_ = dVar3;
  auVar1._0_8_ = dVar3;
  local_28 = (HighsCDouble)divpd((undefined1  [16])*this,auVar1);
  local_38 = operator*(&local_28,v);
  HVar4 = operator-(&local_38,this);
  auVar2._8_8_ = dVar3;
  auVar2._0_8_ = dVar3;
  local_38 = (HighsCDouble)divpd((undefined1  [16])HVar4,auVar2);
  HVar4 = operator-(&local_28,&local_38);
  *this = HVar4;
  return this;
}

Assistant:

HighsCDouble& operator/=(const HighsCDouble& v) {
    double vdbl = v.hi + v.lo;
    HighsCDouble d(hi / vdbl, lo / vdbl);
    HighsCDouble c = d * v - (*this);
    c.hi /= vdbl;
    c.lo /= vdbl;
    *this = d - c;
    return *this;
  }